

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-direct-master.cpp
# Opt level: O0

void __thiscall Block::show_link(Block *this,ProxyWithLink *cp)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  ostream *poVar3;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this_01;
  reference piVar4;
  void *this_02;
  char *in_RDX;
  ProxyWithLink *in_RSI;
  RegularLink<diy::Bounds<int>_> *link;
  RegularLink<diy::Bounds<int>_> *this_00;
  
  iVar1 = diy::Master::ProxyWithLink::link(in_RSI,(char *)in_RSI,in_RDX);
  this_00 = (RegularLink<diy::Bounds<int>_> *)CONCAT44(extraout_var,iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Block (");
  iVar1 = diy::Master::Proxy::gid(&in_RSI->super_Proxy);
  poVar3 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  this_01 = (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)std::operator<<(poVar3,"): ");
  diy::RegularLink<diy::Bounds<int>_>::core(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(this_01,*piVar4);
  poVar3 = std::operator<<(poVar3,' ');
  diy::RegularLink<diy::Bounds<int>_>::core(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,' ');
  diy::RegularLink<diy::Bounds<int>_>::core(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3," - ");
  diy::RegularLink<diy::Bounds<int>_>::core(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,' ');
  diy::RegularLink<diy::Bounds<int>_>::core(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,' ');
  diy::RegularLink<diy::Bounds<int>_>::core(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3," : ");
  diy::RegularLink<diy::Bounds<int>_>::bounds(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,' ');
  diy::RegularLink<diy::Bounds<int>_>::bounds(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,' ');
  diy::RegularLink<diy::Bounds<int>_>::bounds(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3," - ");
  diy::RegularLink<diy::Bounds<int>_>::bounds(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,' ');
  diy::RegularLink<diy::Bounds<int>_>::bounds(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,' ');
  diy::RegularLink<diy::Bounds<int>_>::bounds(this_00);
  piVar4 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (this_01,(size_type)poVar2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar2 = std::operator<<(poVar2," : ");
  iVar1 = diy::Link::size((Link *)0x10fb85);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,' ');
  this_02 = (void *)std::ostream::operator<<(poVar2,std::dec);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void show_link(const diy::Master::ProxyWithLink& cp)
    {
      diy::RegularLink<Bounds>* link = static_cast<diy::RegularLink<Bounds>*>(cp.link());
      std::cout << "Block (" << cp.gid() << "): "
                << link->core().min[0]   << ' ' << link->core().min[1]   << ' ' << link->core().min[2] << " - "
                << link->core().max[0]   << ' ' << link->core().max[1]   << ' ' << link->core().max[2] << " : "
                << link->bounds().min[0] << ' ' << link->bounds().min[1] << ' ' << link->bounds().min[2] << " - "
                << link->bounds().max[0] << ' ' << link->bounds().max[1] << ' ' << link->bounds().max[2] << " : "
                << link->size()   << ' ' //<< std::endl
                << std::dec
                << std::endl;
    }